

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

SUNErrCode
N_VLinearCombinationVectorArray_Serial(int nvec,int nsum,sunrealtype *c,N_Vector **X,N_Vector *Z)

{
  N_Vector *X_00;
  long lVar1;
  ulong uVar2;
  N_Vector *X_01;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  X_00 = *X;
  if (nvec == 1) {
    if (nsum == 2) {
      N_VLinearSum_Serial(*c,*X_00,c[1],*X[1],*Z);
      return 0;
    }
    if (nsum == 1) {
      N_VScale_Serial(*c,*X_00,*Z);
      return 0;
    }
    X_01 = (N_Vector *)malloc((long)nsum << 3);
    uVar3 = 0;
    uVar2 = 0;
    if (0 < nsum) {
      uVar2 = (ulong)(uint)nsum;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      X_01[uVar3] = *X[uVar3];
    }
    N_VLinearCombination_Serial(nsum,c,X_01,*Z);
  }
  else {
    if (nsum == 2) {
      N_VLinearSumVectorArray_Serial(nvec,*c,X_00,c[1],X[1],Z);
      return 0;
    }
    if (nsum != 1) {
      uVar2 = *(*Z)->content;
      uVar3 = 0;
      if (X_00 != Z) {
        if ((long)uVar2 < 1) {
          uVar2 = uVar3;
        }
        uVar4 = (ulong)(uint)nvec;
        if (nvec < 1) {
          uVar4 = uVar3;
        }
        for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
          lVar1 = *(long *)((long)X_00[uVar3]->content + 0x10);
          lVar7 = *(long *)((long)Z[uVar3]->content + 0x10);
          for (uVar6 = 0; lVar5 = 1, uVar2 != uVar6; uVar6 = uVar6 + 1) {
            *(double *)(lVar7 + uVar6 * 8) = *c * *(double *)(lVar1 + uVar6 * 8);
          }
          for (; lVar5 < nsum; lVar5 = lVar5 + 1) {
            lVar1 = *(long *)((long)X[lVar5][uVar3]->content + 0x10);
            for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
              *(double *)(lVar7 + uVar6 * 8) =
                   c[lVar5] * *(double *)(lVar1 + uVar6 * 8) + *(double *)(lVar7 + uVar6 * 8);
            }
          }
        }
        return 0;
      }
      if ((long)uVar2 < 1) {
        uVar2 = uVar3;
      }
      if (0 < nvec) {
        uVar3 = (ulong)(uint)nvec;
      }
      if ((*c == 1.0) && (!NAN(*c))) {
        for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
          lVar1 = *(long *)((long)Z[uVar4]->content + 0x10);
          for (lVar7 = 1; lVar7 < nsum; lVar7 = lVar7 + 1) {
            lVar5 = *(long *)((long)X[lVar7][uVar4]->content + 0x10);
            for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
              *(double *)(lVar1 + uVar6 * 8) =
                   c[lVar7] * *(double *)(lVar5 + uVar6 * 8) + *(double *)(lVar1 + uVar6 * 8);
            }
          }
        }
        return 0;
      }
      for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
        lVar1 = *(long *)((long)Z[uVar4]->content + 0x10);
        for (uVar6 = 0; lVar7 = 1, uVar2 != uVar6; uVar6 = uVar6 + 1) {
          *(double *)(lVar1 + uVar6 * 8) = *c * *(double *)(lVar1 + uVar6 * 8);
        }
        for (; lVar7 < nsum; lVar7 = lVar7 + 1) {
          lVar5 = *(long *)((long)X[lVar7][uVar4]->content + 0x10);
          for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
            *(double *)(lVar1 + uVar6 * 8) =
                 c[lVar7] * *(double *)(lVar5 + uVar6 * 8) + *(double *)(lVar1 + uVar6 * 8);
          }
        }
      }
      return 0;
    }
    X_01 = (N_Vector *)malloc((long)nvec << 3);
    uVar2 = 0;
    uVar3 = 0;
    if (0 < nvec) {
      uVar3 = (ulong)(uint)nvec;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      X_01[uVar2] = (N_Vector)*c;
    }
    N_VScaleVectorArray_Serial(nvec,(sunrealtype *)X_01,X_00,Z);
  }
  free(X_01);
  return 0;
}

Assistant:

SUNErrCode N_VLinearCombinationVectorArray_Serial(int nvec, int nsum,
                                                  sunrealtype* c, N_Vector** X,
                                                  N_Vector* Z)
{
  SUNFunctionBegin(X[0][0]->sunctx);
  int i;          /* vector arrays index in summation [0,nsum) */
  int j;          /* vector index in vector array     [0,nvec) */
  sunindextype k; /* element index in vector          [0,N)    */
  sunindextype N;
  sunrealtype* zd = NULL;
  sunrealtype* xd = NULL;
  sunrealtype* ctmp;
  N_Vector* Y;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1 && nsum >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* ---------------------------
   * Special cases for nvec == 1
   * --------------------------- */

  if (nvec == 1)
  {
    /* should have called N_VScale */
    if (nsum == 1)
    {
      N_VScale_Serial(c[0], X[0][0], Z[0]);
      SUNCheckLastErr();
      return SUN_SUCCESS;
    }

    /* should have called N_VLinearSum */
    if (nsum == 2)
    {
      N_VLinearSum_Serial(c[0], X[0][0], c[1], X[1][0], Z[0]);
      SUNCheckLastErr();
      return SUN_SUCCESS;
    }

    /* should have called N_VLinearCombination */
    Y = (N_Vector*)malloc(nsum * sizeof(N_Vector));
    SUNAssert(Y, SUN_ERR_MALLOC_FAIL);

    for (i = 0; i < nsum; i++) { Y[i] = X[i][0]; }

    SUNCheckCall(N_VLinearCombination_Serial(nsum, c, Y, Z[0]));

    free(Y);

    return SUN_SUCCESS;
  }

  /* --------------------------
   * Special cases for nvec > 1
   * -------------------------- */

  /* should have called N_VScaleVectorArray */
  if (nsum == 1)
  {
    ctmp = (sunrealtype*)malloc(nvec * sizeof(sunrealtype));
    SUNAssert(ctmp, SUN_ERR_MALLOC_FAIL);

    for (j = 0; j < nvec; j++) { ctmp[j] = c[0]; }

    SUNCheckCall(N_VScaleVectorArray_Serial(nvec, ctmp, X[0], Z));

    free(ctmp);
    return SUN_SUCCESS;
  }

  /* should have called N_VLinearSumVectorArray */
  if (nsum == 2)
  {
    SUNCheckCall(N_VLinearSumVectorArray_Serial(nvec, c[0], X[0], c[1], X[1], Z));
    return SUN_SUCCESS;
  }

  /* --------------------------
   * Compute linear combination
   * -------------------------- */

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /*
   * X[0][j] += c[i]*X[i][j], i = 1,...,nvec-1
   */
  if ((X[0] == Z) && (c[0] == ONE))
  {
    for (j = 0; j < nvec; j++)
    {
      zd = NV_DATA_S(Z[j]);
      for (i = 1; i < nsum; i++)
      {
        xd = NV_DATA_S(X[i][j]);
        for (k = 0; k < N; k++) { zd[k] += c[i] * xd[k]; }
      }
    }
    return SUN_SUCCESS;
  }

  /*
   * X[0][j] = c[0] * X[0][j] + sum{ c[i] * X[i][j] }, i = 1,...,nvec-1
   */
  if (X[0] == Z)
  {
    for (j = 0; j < nvec; j++)
    {
      zd = NV_DATA_S(Z[j]);
      for (k = 0; k < N; k++) { zd[k] *= c[0]; }
      for (i = 1; i < nsum; i++)
      {
        xd = NV_DATA_S(X[i][j]);
        for (k = 0; k < N; k++) { zd[k] += c[i] * xd[k]; }
      }
    }
    return SUN_SUCCESS;
  }

  /*
   * Z[j] = sum{ c[i] * X[i][j] }, i = 0,...,nvec-1
   */
  for (j = 0; j < nvec; j++)
  {
    xd = NV_DATA_S(X[0][j]);
    zd = NV_DATA_S(Z[j]);
    for (k = 0; k < N; k++) { zd[k] = c[0] * xd[k]; }
    for (i = 1; i < nsum; i++)
    {
      xd = NV_DATA_S(X[i][j]);
      for (k = 0; k < N; k++) { zd[k] += c[i] * xd[k]; }
    }
  }
  return SUN_SUCCESS;
}